

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VScaleAddMultiVectorArray(N_Vector V,sunindextype param_2,int myid)

{
  sunindextype sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  N_Vector *Y [3];
  N_Vector *Z [3];
  timespec spec;
  int local_ac;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  sunindextype local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  timespec local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_80 = param_2;
  puVar11 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_98 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_90 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_88 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_78 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_70 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_68 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  local_ac = 1;
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,1,&local_48,puVar11,&local_98,&local_98);
  sync_device(V);
  clock_gettime(1,&local_58);
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(1.0,(N_Vector)*local_98,local_80);
    if (iVar2 != 0) goto LAB_0010beb4;
    local_ac = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 1a ");
    }
  }
  else {
LAB_0010beb4:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar14 = max_time(V,(dVar15 / 1000000000.0 + (double)lVar13) -
                      (dVar14 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  N_VConst(0,*local_78);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,1,&local_48,puVar11,&local_98,&local_78);
  sync_device(V);
  clock_gettime(1,&local_58);
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(1.0,(N_Vector)*local_78,local_80);
    if (iVar2 != 0) goto LAB_0010c014;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 1b ");
    }
  }
  else {
LAB_0010c014:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  N_VConst(0,*local_90);
  N_VConst(0,*local_88);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,3,&local_48,puVar11,&local_98,&local_98);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_98,local_80);
    iVar3 = check_ans(0.0,(N_Vector)*local_90,sVar1);
    iVar4 = check_ans(1.0,(N_Vector)*local_88,sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010c1e0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 2a ");
    }
  }
  else {
LAB_0010c1e0:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0xc000000000000000;
  local_38 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  N_VConst(0,*local_90);
  N_VConst(0,*local_88);
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,3,&local_48,puVar11,&local_98,&local_78);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_78,local_80);
    iVar3 = check_ans(0.0,(N_Vector)*local_70,sVar1);
    iVar4 = check_ans(1.0,(N_Vector)*local_68,sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010c3e8;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 2b ");
    }
  }
  else {
LAB_0010c3e8:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,puVar11[1]);
  N_VConst(0,puVar11[2]);
  N_VConst(0,*local_98);
  N_VConst(0,local_98[1]);
  N_VConst(0,local_98[2]);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,1,&local_48,puVar11,&local_98,&local_98);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_98,local_80);
    iVar3 = check_ans(0.0,(N_Vector)local_98[1],sVar1);
    iVar4 = check_ans(1.0,(N_Vector)local_98[2],sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010c5cc;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 3a ");
    }
  }
  else {
LAB_0010c5cc:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x4000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,puVar11[1]);
  N_VConst(0,puVar11[2]);
  N_VConst(0,*local_98);
  N_VConst(0,local_98[1]);
  N_VConst(0,local_98[2]);
  N_VConst(0,*local_78);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_78[2]);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,1,&local_48,puVar11,&local_98,&local_78);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_78,local_80);
    iVar3 = check_ans(0.0,(N_Vector)local_78[1],sVar1);
    iVar4 = check_ans(1.0,(N_Vector)local_78[2],sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010c7f3;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 3b ");
    }
  }
  else {
LAB_0010c7f3:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3ff0000000000000;
  local_38 = 0xc000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  N_VConst(0,*local_90);
  N_VConst(0,*local_88);
  N_VConst(0,puVar11[1]);
  N_VConst(0,local_98[1]);
  N_VConst(0,local_90[1]);
  N_VConst(0,local_88[1]);
  N_VConst(0,puVar11[2]);
  N_VConst(0,local_98[2]);
  N_VConst(0,local_90[2]);
  N_VConst(0,local_88[2]);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar15 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,3,&local_48,puVar11,&local_98,&local_98);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_98,local_80);
    iVar3 = check_ans(0.0,(N_Vector)*local_90,sVar1);
    iVar4 = check_ans(1.0,(N_Vector)*local_88,sVar1);
    iVar5 = check_ans(1.0,(N_Vector)local_98[1],sVar1);
    iVar6 = check_ans(-1.0,(N_Vector)local_90[1],sVar1);
    iVar7 = check_ans(0.0,(N_Vector)local_88[1],sVar1);
    iVar8 = check_ans(-2.0,(N_Vector)local_98[2],sVar1);
    iVar9 = check_ans(2.0,(N_Vector)local_90[2],sVar1);
    iVar10 = check_ans(0.0,(N_Vector)local_88[2],sVar1);
    if (iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 != 0)
    goto LAB_0010cb15;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 4a ");
    }
  }
  else {
LAB_0010cb15:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n",(ulong)(uint)myid);
    local_ac = local_ac + 1;
  }
  dVar14 = max_time(V,(dVar14 / 1000000000.0 + (double)lVar13) -
                      (dVar15 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3ff0000000000000;
  local_38 = 0xc000000000000000;
  N_VConst(0,*puVar11);
  N_VConst(0,*local_98);
  N_VConst(0,*local_90);
  N_VConst(0,*local_88);
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  N_VConst(0,puVar11[1]);
  N_VConst(0,local_98[1]);
  N_VConst(0,local_90[1]);
  N_VConst(0,local_88[1]);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_68[1]);
  N_VConst(0,puVar11[2]);
  N_VConst(0,local_98[2]);
  N_VConst(0,local_90[2]);
  N_VConst(0,local_88[2]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  N_VConst(0,local_68[2]);
  clock_gettime(1,&local_58);
  lVar12 = local_58.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_58.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,3,&local_48,puVar11,&local_98,&local_78);
  sync_device(V);
  clock_gettime(1,&local_58);
  sVar1 = local_80;
  lVar13 = local_58.tv_sec - base_time_tv_sec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,(N_Vector)*local_78,local_80);
    iVar3 = check_ans(0.0,(N_Vector)*local_70,sVar1);
    iVar4 = check_ans(1.0,(N_Vector)*local_68,sVar1);
    iVar5 = check_ans(1.0,(N_Vector)local_78[1],sVar1);
    iVar6 = check_ans(-1.0,(N_Vector)local_70[1],sVar1);
    iVar7 = check_ans(0.0,(N_Vector)local_68[1],sVar1);
    iVar8 = check_ans(-2.0,(N_Vector)local_78[2],sVar1);
    iVar9 = check_ans(2.0,(N_Vector)local_70[2],sVar1);
    iVar10 = check_ans(0.0,(N_Vector)local_68[2],sVar1);
    if (iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleAddMultiVectorArray Case 4b ");
      }
      goto LAB_0010cf0a;
    }
  }
  printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n",(ulong)(uint)myid);
  local_ac = local_ac + 1;
LAB_0010cf0a:
  dVar14 = max_time(V,((double)local_58.tv_nsec / 1000000000.0 + (double)lVar13) -
                      (dVar14 / 1000000000.0 + (double)lVar12));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar14,0),"N_VScaleAddMultiVectorArray");
  }
  N_VDestroyVectorArray(puVar11,3);
  N_VDestroyVectorArray(local_98,3);
  N_VDestroyVectorArray(local_90,3);
  N_VDestroyVectorArray(local_88,3);
  N_VDestroyVectorArray(local_78,3);
  N_VDestroyVectorArray(local_70,3);
  N_VDestroyVectorArray(local_68,3);
  return local_ac;
}

Assistant:

int Test_N_VScaleAddMultiVectorArray(N_Vector V, sunindextype local_length,
                                     int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype a[3];
  N_Vector* X;
  N_Vector* Y[3];
  N_Vector* Z[3];

  /* create vectors for testing */
  X = N_VCloneVectorArray(3, V);

  Y[0] = N_VCloneVectorArray(3, V);
  Y[1] = N_VCloneVectorArray(3, V);
  Y[2] = N_VCloneVectorArray(3, V);

  Z[0] = N_VCloneVectorArray(3, V);
  Z[1] = N_VCloneVectorArray(3, V);
  Z[2] = N_VCloneVectorArray(3, V);

  /*
   * Case 1a (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE, X[0]);
  N_VConst(NEG_ONE, Y[0][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[0][0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 1b (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE, X[0]);
  N_VConst(NEG_ONE, Y[0][0]);
  N_VConst(ZERO, Z[0][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0][0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2a (nvec = 1, nsum > 1):
   * Y[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[1][0], local_length);
    failure += check_ans(ONE, Y[2][0], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2b (nvec = 1, nsum > 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  N_VConst(ZERO, Z[0][0]);
  N_VConst(ONE, Z[1][0]);
  N_VConst(TWO, Z[2][0]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[1][0], local_length);
    failure += check_ans(ONE, Z[2][0], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3a (nvec > 1, nsum = 1):
   * Y[0][i] = a[0] X[i] + Y[0][i], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE, X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  /* Y[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[0][1], local_length);
    failure += check_ans(ONE, Y[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3b (nvec > 1, nsum = 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE, X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO, Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  N_VConst(TWO, Z[0][0]);
  N_VConst(TWO, Z[0][1]);
  N_VConst(TWO, Z[0][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[0][1], local_length);
    failure += check_ans(ONE, Z[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4a (nvec > 1, nsum > 1):
   * Y[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF, X[0]);
  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO, Y[2][0]);

  N_VConst(ONE, X[1]);
  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO, Y[2][1]);

  N_VConst(NEG_TWO, X[2]);
  N_VConst(TWO, Y[0][2]);
  N_VConst(TWO * TWO, Y[1][2]);
  N_VConst(NEG_TWO * TWO, Y[2][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Y);
  sync_device(V);
  stop_time = get_time();

  if (ierr == 0)
  {
    /* Y[i][0] should be vector of -1, 0, +1 */
    failure = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO, Y[1][0], local_length);
    failure += check_ans(ONE, Y[2][0], local_length);

    /* Y[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE, Y[0][1], local_length);
    failure += check_ans(NEG_ONE, Y[1][1], local_length);
    failure += check_ans(ZERO, Y[2][1], local_length);

    /* Y[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Y[0][2], local_length);
    failure += check_ans(TWO, Y[1][2], local_length);
    failure += check_ans(ZERO, Y[2][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4b (nvec > 1, nsum > 1):
   * Z[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO, Y[2][0]);

  N_VConst(HALF, Z[0][0]);
  N_VConst(HALF, Z[1][0]);
  N_VConst(HALF, Z[2][0]);

  N_VConst(ONE, X[1]);

  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO, Y[2][1]);

  N_VConst(HALF, Z[0][1]);
  N_VConst(HALF, Z[1][1]);
  N_VConst(HALF, Z[2][1]);

  N_VConst(NEG_TWO, X[2]);

  N_VConst(TWO, Y[0][2]);
  N_VConst(TWO * TWO, Y[1][2]);
  N_VConst(NEG_TWO * TWO, Y[2][2]);

  N_VConst(HALF, Z[0][2]);
  N_VConst(HALF, Z[1][2]);
  N_VConst(HALF, Z[2][2]);

  start_time = get_time();
  ierr       = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Z);
  sync_device(V);
  stop_time = get_time();

  if (ierr == 0)
  {
    /* Z[i][0] should be vector of -1, 0, +1 */
    failure = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO, Z[1][0], local_length);
    failure += check_ans(ONE, Z[2][0], local_length);

    /* Z[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE, Z[0][1], local_length);
    failure += check_ans(NEG_ONE, Z[1][1], local_length);
    failure += check_ans(ZERO, Z[2][1], local_length);

    /* Z[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Z[0][2], local_length);
    failure += check_ans(TWO, Z[1][2], local_length);
    failure += check_ans(ZERO, Z[2][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(X, 3);
  N_VDestroyVectorArray(Y[0], 3);
  N_VDestroyVectorArray(Y[1], 3);
  N_VDestroyVectorArray(Y[2], 3);
  N_VDestroyVectorArray(Z[0], 3);
  N_VDestroyVectorArray(Z[1], 3);
  N_VDestroyVectorArray(Z[2], 3);

  return (fails);
}